

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O0

void __thiscall MeshDenoisingViaL0Minimization::initParameters(MeshDenoisingViaL0Minimization *this)

{
  ParameterSet *pPVar1;
  size_t sVar2;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [32];
  double local_348;
  double mean_dihedral_angle;
  double mean_edge_length;
  string local_330 [39];
  allocator local_309;
  string local_308 [32];
  undefined1 local_2e8 [8];
  TriMesh mesh;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  MeshDenoisingViaL0Minimization *local_10;
  MeshDenoisingViaL0Minimization *this_local;
  
  local_10 = this;
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"mu_beta",&local_31);
  ParameterSet::addParameter(pPVar1,(string *)local_30,1.414);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"beta",&local_69);
  ParameterSet::addParameter(pPVar1,(string *)local_68,0.001);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"beta_max",&local_91);
  ParameterSet::addParameter(pPVar1,(string *)local_90,1000.0);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"mu_alpha",
             (allocator *)
             ((long)&mesh.super_Mesh.
                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                     .
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     .refcount_ftextureIndex_ + 3));
  ParameterSet::addParameter(pPVar1,(string *)local_b8,0.5);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mesh.super_Mesh.
                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                     .
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     .refcount_ftextureIndex_ + 3));
  DataManager::getNoisyMesh((TriMesh *)local_2e8,(this->super_MeshDenoisingBase).data_manager_);
  sVar2 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)local_2e8);
  if (sVar2 == 0) {
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,"alpha",&local_309);
    ParameterSet::addParameter(pPVar1,(string *)local_308,0.0001);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"lambda",(allocator *)((long)&mean_edge_length + 7));
    ParameterSet::addParameter(pPVar1,(string *)local_330,0.0001);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mean_edge_length + 7));
  }
  else {
    mean_dihedral_angle =
         MeshDenoisingBase::getAverageEdgeLength
                   (&this->super_MeshDenoisingBase,(TriMesh *)local_2e8);
    local_348 = getAverageDihedralAngle(this,(TriMesh *)local_2e8);
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"alpha",&local_369);
    ParameterSet::addParameter(pPVar1,(string *)local_368,local_348 * 0.1);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"lambda",&local_391);
    ParameterSet::addParameter
              (pPVar1,(string *)local_390,
               mean_dihedral_angle * 0.2 * mean_dihedral_angle * local_348);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
  }
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_2e8);
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("mu_beta"), 1.414);
    parameter_set_->addParameter(string("beta"), 0.001);
    parameter_set_->addParameter(string("beta_max"), 1000.0);
    parameter_set_->addParameter(string("mu_alpha"), 0.5);

    TriMesh mesh = data_manager_->getNoisyMesh();
    if(mesh.n_vertices() == 0)
    {
        parameter_set_->addParameter(string("alpha"), 0.0001);
        parameter_set_->addParameter(string("lambda"), 0.0001);
    }
    else
    {
        double mean_edge_length = getAverageEdgeLength(mesh);
        double mean_dihedral_angle = getAverageDihedralAngle(mesh);
        parameter_set_->addParameter(string("alpha"), 0.1 * mean_dihedral_angle);
        parameter_set_->addParameter(string("lambda"), 0.2 * mean_edge_length * mean_edge_length * mean_dihedral_angle);
    }

}